

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

void __thiscall Scene::camera(Scene *this,double x,double y,Ray *ray)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  (ray->org).x = (this->eye).x;
  (ray->org).y = (this->eye).y;
  (ray->org).z = (this->eye).z;
  if (this->aperture <= 0.0) {
    dVar9 = (this->view_y).x * y + (this->view_x).x * x + (this->eye_dir).x;
    dVar8 = (this->view_y).y * y + (this->view_x).y * x + (this->eye_dir).y;
    dVar4 = y * (this->view_y).z + x * (this->view_x).z + (this->eye_dir).z;
    dVar5 = dVar4 * dVar4 + dVar9 * dVar9 + dVar8 * dVar8;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    (ray->dir).x = dVar9 / dVar5;
    (ray->dir).y = dVar8 / dVar5;
    (ray->dir).z = dVar4 / dVar5;
  }
  else {
    iVar1 = rand();
    dVar2 = (double)iVar1;
    dVar5 = (this->view_x).x;
    dVar4 = (this->view_x).y;
    dVar8 = (this->view_x).z;
    iVar1 = rand();
    dVar3 = (double)iVar1;
    dVar9 = this->aperture;
    dVar6 = (((this->view_y).x * dVar3 + dVar5 * dVar2) * dVar9) / 2147483647.0;
    dVar7 = (((this->view_y).y * dVar3 + dVar4 * dVar2) * dVar9) / 2147483647.0;
    dVar4 = ((dVar3 * (this->view_y).z + dVar2 * dVar8) * dVar9) / 2147483647.0;
    (ray->org).x = (ray->org).x + dVar6;
    (ray->org).y = (ray->org).y + dVar7;
    (ray->org).z = (ray->org).z + dVar4;
    dVar5 = this->focus;
    dVar6 = ((this->view_y).x * y + (this->view_x).x * x + (this->eye_dir).x * dVar5) - dVar6;
    dVar7 = ((this->view_y).y * y + (this->view_x).y * x + (this->eye_dir).y * dVar5) - dVar7;
    dVar4 = (y * (this->view_y).z + x * (this->view_x).z + dVar5 * (this->eye_dir).z) - dVar4;
    (ray->dir).x = dVar6;
    (ray->dir).y = dVar7;
    (ray->dir).z = dVar4;
    dVar5 = dVar4 * dVar4 + dVar6 * dVar6 + dVar7 * dVar7;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    (ray->dir).x = dVar6 / dVar5;
    (ray->dir).y = dVar7 / dVar5;
    (ray->dir).z = dVar4 / dVar5;
  }
  return;
}

Assistant:

void Scene::camera(double x, double y, Ray& ray)
{
    ray.org  = eye;
    if (aperture > 0.0) // камера не точечная, исп с AdaptiveDistRenderScene
    {
        // построить случайную точку на  линзе
        Vector lens_point = (view_x * (double)rand() + view_y * (double)rand()) * aperture / RAND_MAX;
        ray.org += lens_point;
        ray.dir = eye_dir * focus + view_x * x + view_y * y - lens_point;
        ray.dir = normalize(ray.dir);
    } else {
        ray.dir  = normalize(eye_dir + view_x * x + view_y * y);
    }
}